

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PSound::WriteValue(PSound *this,FArchive *ar,void *addr)

{
  char *name;
  
  FArchive::WriteByte(ar,'\r');
  if ((long)*addr == 0) {
    name = (char *)0x0;
  }
  else {
    name = S_sfx.Array[*addr].name.Chars;
  }
  FArchive::WriteName(ar,name);
  return;
}

Assistant:

void PSound::WriteValue(FArchive &ar, const void *addr) const
{
	ar.WriteByte(VAL_Name);
	ar.WriteName(*(const FSoundID *)addr);
}